

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O1

void update_zeromv_cnt(AV1_COMP *cpi,MB_MODE_INFO *mi,int mi_row,int mi_col,BLOCK_SIZE bsize)

{
  ulong uVar1;
  uint8_t uVar2;
  int iVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  short sVar15;
  short sVar19;
  short sVar20;
  short sVar21;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar22 [16];
  
  if ((mi->ref_frame[0] == '\x01') && ((*(ushort *)&mi->field_0xa7 & 7) < 3)) {
    iVar3 = (cpi->common).mi_params.mi_cols;
    uVar11 = iVar3 - mi_col >> 1;
    if ((int)(uint)("\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                    [bsize] >> 1) <= (int)uVar11) {
      uVar11 = (uint)("\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                      [bsize] >> 1);
    }
    uVar8 = (cpi->common).mi_params.mi_rows - mi_row >> 1;
    if ((int)(uint)("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                    [bsize] >> 1) <= (int)uVar8) {
      uVar8 = (uint)("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                     [bsize] >> 1);
    }
    if (0 < (int)uVar8) {
      uVar1 = *(ulong *)mi->mv;
      auVar16._8_8_ = 0;
      auVar16._0_8_ = uVar1;
      sVar15 = (short)uVar1;
      sVar4 = -sVar15;
      sVar19 = (short)(uVar1 >> 0x10);
      sVar5 = -sVar19;
      sVar20 = (short)(uVar1 >> 0x20);
      sVar6 = -sVar20;
      sVar21 = (short)(uVar1 >> 0x30);
      sVar7 = -sVar21;
      auVar22._0_2_ = (ushort)(sVar4 < sVar15) * sVar15 | (ushort)(sVar4 >= sVar15) * sVar4;
      auVar22._2_2_ = (ushort)(sVar5 < sVar19) * sVar19 | (ushort)(sVar5 >= sVar19) * sVar5;
      auVar22._4_2_ = (ushort)(sVar6 < sVar20) * sVar20 | (ushort)(sVar6 >= sVar20) * sVar6;
      auVar22._6_2_ = (ushort)(sVar7 < sVar21) * sVar21 | (ushort)(sVar7 >= sVar21) * sVar7;
      auVar22._8_8_ = 0;
      auVar16 = pshuflw(auVar16,auVar22,0x50);
      auVar17._0_4_ = auVar16._0_4_;
      auVar17._4_4_ = auVar17._0_4_;
      auVar17._8_4_ = auVar16._4_4_;
      auVar17._12_4_ = auVar16._4_4_;
      auVar17 = auVar17 ^ _DAT_004dab60;
      auVar18._0_2_ = -(ushort)(-0x7ff7 < auVar17._0_2_);
      auVar18._2_2_ = -(ushort)(-0x7ff7 < auVar17._2_2_);
      auVar18._4_2_ = -(ushort)(-0x7ff7 < auVar17._4_2_);
      auVar18._6_2_ = -(ushort)(-0x7ff7 < auVar17._6_2_);
      auVar18._8_2_ = -(ushort)(-0x7ff7 < auVar17._8_2_);
      auVar18._10_2_ = -(ushort)(-0x7ff7 < auVar17._10_2_);
      auVar18._12_2_ = -(ushort)(-0x7ff7 < auVar17._12_2_);
      auVar18._14_2_ = -(ushort)(-0x7ff7 < auVar17._14_2_);
      iVar9 = movmskpd(mi_row >> 1,auVar18);
      uVar10 = 0;
      do {
        iVar12 = (mi_col >> 1) + (iVar3 >> 1) * (mi_row >> 1);
        uVar13 = uVar11;
        if (0 < (int)uVar11) {
          do {
            iVar14 = ((cpi->common).mi_params.mi_cols >> 1) * uVar10 + iVar12;
            if (iVar9 == 0) {
              uVar2 = cpi->consec_zero_mv[iVar14];
              if (uVar2 != 0xff) {
                cpi->consec_zero_mv[iVar14] = uVar2 + '\x01';
              }
            }
            else {
              cpi->consec_zero_mv[iVar14] = '\0';
            }
            iVar12 = iVar12 + 1;
            uVar13 = uVar13 - 1;
          } while (uVar13 != 0);
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 != uVar8);
    }
  }
  return;
}

Assistant:

static void update_zeromv_cnt(const AV1_COMP *const cpi,
                              const MB_MODE_INFO *const mi, int mi_row,
                              int mi_col, BLOCK_SIZE bsize) {
  if (mi->ref_frame[0] != LAST_FRAME || !is_inter_block(mi) ||
      mi->segment_id > CR_SEGMENT_ID_BOOST2) {
    return;
  }
  const AV1_COMMON *const cm = &cpi->common;
  const MV mv = mi->mv[0].as_mv;
  const int bw = mi_size_wide[bsize] >> 1;
  const int bh = mi_size_high[bsize] >> 1;
  const int xmis = AOMMIN((cm->mi_params.mi_cols - mi_col) >> 1, bw);
  const int ymis = AOMMIN((cm->mi_params.mi_rows - mi_row) >> 1, bh);
  const int block_index =
      (mi_row >> 1) * (cm->mi_params.mi_cols >> 1) + (mi_col >> 1);
  for (int y = 0; y < ymis; y++) {
    for (int x = 0; x < xmis; x++) {
      // consec_zero_mv is in the scale of 8x8 blocks
      const int map_offset = block_index + y * (cm->mi_params.mi_cols >> 1) + x;
      if (abs(mv.row) < 10 && abs(mv.col) < 10) {
        if (cpi->consec_zero_mv[map_offset] < 255)
          cpi->consec_zero_mv[map_offset]++;
      } else {
        cpi->consec_zero_mv[map_offset] = 0;
      }
    }
  }
}